

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

void __thiscall QDialogButtonBoxPrivate::layoutButtons(QDialogButtonBoxPrivate *this)

{
  bool bVar1;
  QWidget *this_00;
  ulong originalLength;
  QWidget *second;
  byte bVar2;
  Data *pDVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  CutResult CVar7;
  int iVar8;
  long *plVar9;
  QWidget *pQVar10;
  uint *puVar11;
  QWidget **__dest;
  iterator iVar12;
  iterator iVar13;
  long lVar14;
  QList<QAbstractButton_*> *buttonList;
  uint uVar15;
  ButtonLayout BVar16;
  qsizetype qVar17;
  long in_FS_OFFSET;
  qsizetype p;
  QList<QWidget_*> local_68;
  qsizetype local_48;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = this->ignoreShowAndHide;
  this->ignoreShowAndHide = true;
  iVar5 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
  if (0 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      plVar9 = (long *)(**(code **)(*(long *)&this->buttonLayout->super_QLayout + 0xb0))
                                 (this->buttonLayout,iVar5 + -2);
      pQVar10 = (QWidget *)(**(code **)(*plVar9 + 0x68))(plVar9);
      if (pQVar10 != (QWidget *)0x0) {
        QWidget::hide(pQVar10);
      }
      (**(code **)(*plVar9 + 8))(plVar9);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  BVar16 = this->layoutPolicy;
  if (BVar16 == MacLayout) {
    lVar14 = 0;
    do {
      if (this->buttonLists[*(int *)((long)layoutButtons::ModalRoles + lVar14)].d.size != 0) {
        BVar16 = MacLayout;
        goto LAB_00476549;
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x14);
    BVar16 = AndroidLayout;
  }
LAB_00476549:
  puVar11 = (uint *)QPlatformDialogHelper::buttonLayout(this->orientation,BVar16);
  if (this->center == true) {
    QBoxLayout::addStretch(this->buttonLayout,0);
  }
  uVar15 = *puVar11;
  if (uVar15 != 0xffffffff) {
    do {
      puVar11 = puVar11 + 1;
      uVar6 = uVar15 & 0xbfffffff;
      bVar2 = (byte)(uVar15 >> 0x18);
      switch(uVar6) {
      case 0:
        if (this->buttonLists[0].d.size != 0) {
          pQVar10 = &(*this->buttonLists[0].d.ptr)->super_QWidget;
          QBoxLayout::addWidget(this->buttonLayout,pQVar10,0,(Alignment)0x0);
          QWidget::show(pQVar10);
        }
        break;
      case 1:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
        buttonList = this->buttonLists + (int)uVar6;
LAB_004765c9:
        addButtonsToLayout(this,buttonList,(bool)(bVar2 >> 6 & 1));
        break;
      case 2:
        buttonList = this->buttonLists + 2;
        if (BVar16 != MacLayout) goto LAB_004765c9;
        if ((this->buttonLists[2].d.size != 0) &&
           (iVar5 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))(), 1 < iVar5))
        {
          QBoxLayout::addSpacing(this->buttonLayout,0x1c);
        }
        addButtonsToLayout(this,this->buttonLists + 2,(bool)(bVar2 >> 6 & 1));
        if (this->buttonLists[2].d.size != 0) {
          QBoxLayout::addSpacing(this->buttonLayout,0x1c);
        }
        break;
      default:
        if (uVar6 == 0x10000000) {
          originalLength = this->buttonLists[0].d.size;
          if (1 < originalLength) {
            local_40 = (QWidget *)0x1;
            local_48 = -1;
            CVar7 = QtPrivate::QContainerImplHelper::mid
                              (originalLength,(qsizetype *)&local_40,&local_48);
            if (CVar7 < Full) {
              local_68.d.d = (Data *)0x0;
              local_68.d.ptr = (QWidget **)0x0;
              local_68.d.size = 0;
            }
            else if (CVar7 == Full) {
              local_68.d.d = (Data *)this->buttonLists[0].d.d;
              local_68.d.ptr = (QWidget **)this->buttonLists[0].d.ptr;
              local_68.d.size = this->buttonLists[0].d.size;
              if ((QArrayData *)local_68.d.d != (QArrayData *)0x0) {
                LOCK();
                (((QArrayData *)&((QArrayData *)local_68.d.d)->ref_)->ref_)._q_value.
                super___atomic_base<int>._M_i =
                     (((QArrayData *)&((QArrayData *)local_68.d.d)->ref_)->ref_)._q_value.
                     super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
            }
            else {
              local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              __dest = (QWidget **)
                       QArrayData::allocate((QArrayData **)&local_68,8,0x10,local_48,KeepSize);
              qVar17 = local_48;
              pDVar3 = local_68.d.d;
              if (local_48 == 0) {
                qVar17 = 0;
              }
              else {
                memcpy(__dest,this->buttonLists[0].d.ptr + (long)local_40,local_48 * 8);
              }
              local_68.d.d = pDVar3;
              local_68.d.ptr = __dest;
              local_68.d.size = qVar17;
              if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                LOCK();
                (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar3->super_QArrayData,8,0x10);
                }
              }
            }
            addButtonsToLayout(this,(QList<QAbstractButton_*> *)&local_68,(bool)(bVar2 >> 6 & 1));
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
              }
            }
          }
        }
        else if ((uVar6 == 0x20000000) && (this->center == false)) {
          QBoxLayout::addStretch(this->buttonLayout,0);
        }
      }
      uVar15 = *puVar11;
    } while (uVar15 != 0xffffffff);
  }
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (QWidget **)0x0;
  local_68.d.size = 0;
  iVar5 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      plVar9 = (long *)(**(code **)(*(long *)&this->buttonLayout->super_QLayout + 0xa8))();
      pQVar10 = (QWidget *)(**(code **)(*plVar9 + 0x68))(plVar9);
      if (pQVar10 != (QWidget *)0x0) {
        local_40 = pQVar10;
        QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                  ((QPodArrayOps<QWidget*> *)&local_68,local_68.d.size,&local_40);
        QList<QWidget_*>::end(&local_68);
      }
      iVar5 = iVar5 + 1;
      iVar8 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
    } while (iVar5 < iVar8);
  }
  QWidget::setFocusProxy(this_00,(QWidget *)0x0);
  if (local_68.d.size != 0) {
    pQVar10 = local_68.d.ptr[local_68.d.size + -1];
    iVar12 = QList<QWidget_*>::begin(&local_68);
    iVar13 = QList<QWidget_*>::end(&local_68);
    for (; iVar12.i != iVar13.i; iVar12.i = iVar12.i + 1) {
      second = *iVar12.i;
      QWidget::setTabOrder(pQVar10,second);
      pQVar10 = (QWidget *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
      if ((pQVar10 != (QWidget *)0x0) &&
         (bVar4 = QPushButton::isDefault((QPushButton *)pQVar10), bVar4)) {
        QWidget::setFocusProxy(this_00,pQVar10);
      }
      pQVar10 = second;
    }
  }
  if (this->center == true) {
    QBoxLayout::addStretch(this->buttonLayout,0);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
    }
  }
  this->ignoreShowAndHide = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::layoutButtons()
{
    Q_Q(QDialogButtonBox);
    const int MacGap = 36 - 8;    // 8 is the default gap between a widget and a spacer item

    QScopedValueRollback blocker(ignoreShowAndHide, true);
    for (int i = buttonLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = buttonLayout->takeAt(i);
        if (QWidget *widget = item->widget())
            widget->hide();
        delete item;
    }

    int tmpPolicy = layoutPolicy;

    static const int M = 5;
    static const int ModalRoles[M] = { QPlatformDialogHelper::AcceptRole, QPlatformDialogHelper::RejectRole,
        QPlatformDialogHelper::DestructiveRole, QPlatformDialogHelper::YesRole, QPlatformDialogHelper::NoRole };
    if (tmpPolicy == QDialogButtonBox::MacLayout) {
        bool hasModalButton = false;
        for (int i = 0; i < M; ++i) {
            if (!buttonLists[ModalRoles[i]].isEmpty()) {
                hasModalButton = true;
                break;
            }
        }
        if (!hasModalButton)
            tmpPolicy = 4;  // Mac modeless
    }

    const int *currentLayout = QPlatformDialogHelper::buttonLayout(
        orientation, static_cast<QPlatformDialogHelper::ButtonLayout>(tmpPolicy));

    if (center)
        buttonLayout->addStretch();

    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QPlatformDialogHelper::AcceptRole];

    while (*currentLayout != QPlatformDialogHelper::EOL) {
        int role = (*currentLayout & ~QPlatformDialogHelper::Reverse);
        bool reverse = (*currentLayout & QPlatformDialogHelper::Reverse);

        switch (role) {
        case QPlatformDialogHelper::Stretch:
            if (!center)
                buttonLayout->addStretch();
            break;
        case QPlatformDialogHelper::AcceptRole: {
            if (acceptRoleList.isEmpty())
                break;
            // Only the first one
            QAbstractButton *button = acceptRoleList.first();
            buttonLayout->addWidget(button);
            button->show();
        }
            break;
        case QPlatformDialogHelper::AlternateRole:
            if (acceptRoleList.size() > 1)
                addButtonsToLayout(acceptRoleList.mid(1), reverse);
            break;
        case QPlatformDialogHelper::DestructiveRole:
            {
                const QList<QAbstractButton *> &list = buttonLists[role];

                /*
                    Mac: Insert a gap on the left of the destructive
                    buttons to ensure that they don't get too close to
                    the help and action buttons (but only if there are
                    some buttons to the left of the destructive buttons
                    (and the stretch, whence buttonLayout->count() > 1
                    and not 0)).
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout
                        && !list.isEmpty() && buttonLayout->count() > 1)
                    buttonLayout->addSpacing(MacGap);

                addButtonsToLayout(list, reverse);

                /*
                    Insert a gap between the destructive buttons and the
                    accept and reject buttons.
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout && !list.isEmpty())
                    buttonLayout->addSpacing(MacGap);
            }
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::ActionRole:
        case QPlatformDialogHelper::HelpRole:
        case QPlatformDialogHelper::YesRole:
        case QPlatformDialogHelper::NoRole:
        case QPlatformDialogHelper::ApplyRole:
        case QPlatformDialogHelper::ResetRole:
            addButtonsToLayout(buttonLists[role], reverse);
        }
        ++currentLayout;
    }

    QWidgetList layoutWidgets;
    for (int i = 0; i < buttonLayout->count(); ++i) {
        if (auto *widget = buttonLayout->itemAt(i)->widget())
            layoutWidgets << widget;
    }

    q->setFocusProxy(nullptr);
    if (!layoutWidgets.isEmpty()) {
        QWidget *prev = layoutWidgets.constLast();
        for (QWidget *here : layoutWidgets) {
            QWidget::setTabOrder(prev, here);
            prev = here;
            if (auto *pushButton = qobject_cast<QPushButton *>(prev); pushButton && pushButton->isDefault())
                q->setFocusProxy(pushButton);
        }
    }

    if (center)
        buttonLayout->addStretch();
}